

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_tests.cpp
# Opt level: O2

void __thiscall span_tests::span_constructor_sfinae::test_method(span_constructor_sfinae *this)

{
  _Base_ptr p_Var1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  check_type cVar4;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  assertion_result local_108;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 local_b8 [16];
  _Rb_tree_node_base local_a8;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x3f;
  file.m_begin = (iterator)&local_78;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_88,msg);
  local_a8._M_left = (_Base_ptr)0x0;
  local_a8._M_color = _S_red;
  local_a8._4_4_ = 0;
  local_a8._M_parent = (_Base_ptr)0x0;
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_b8;
  local_b8._0_8_ = "Spannable(std::vector<int>{})";
  local_b8._8_8_ = "";
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_c0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)&local_68,1,0,WARN,_cVar4,(size_t)&local_c8,0x3f);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_b8 + 0x10));
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x40;
  file_00.m_begin = (iterator)&local_d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e8,msg_00
            );
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = (_func_int **)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_color._0_1_ = _S_black;
  local_a8._M_parent = (_Base_ptr)0x0;
  local_a8._M_left = (_Base_ptr)0x0;
  local_b8._0_8_ = "!Spannable(std::set<int>{})";
  local_b8._8_8_ = "";
  local_108.m_message.px = (element_type *)((ulong)local_108.m_message.px & 0xffffffffffffff00);
  local_108._0_8_ = &PTR__lazy_ostream_0113a070;
  local_108.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f0 = local_b8;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_110 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)(local_b8 + 0x10),(lazy_ostream *)&local_108,1,0,WARN,_cVar4,
             (size_t)&local_118,0x40);
  boost::detail::shared_count::~shared_count((shared_count *)&local_a8._M_left);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_68);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x41;
  file_01.m_begin = (iterator)&local_128;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_138,
             msg_01);
  local_68._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = (_func_int **)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  local_a8._M_color._0_1_ = 1;
  local_a8._M_parent = (_Base_ptr)0x0;
  local_a8._M_left = (_Base_ptr)0x0;
  local_b8._0_8_ = "!Spannable(std::vector<bool>{})";
  local_b8._8_8_ = "";
  local_108.m_message.px = (element_type *)((ulong)local_108.m_message.px & 0xffffffffffffff00);
  local_108._0_8_ = &PTR__lazy_ostream_0113a070;
  local_108.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f0 = local_b8;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_140 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)(local_b8 + 0x10),(lazy_ostream *)&local_108,1,0,WARN,_cVar4,
             (size_t)&local_148,0x41);
  boost::detail::shared_count::~shared_count((shared_count *)&local_a8._M_left);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&local_68);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x42;
  file_02.m_begin = (iterator)&local_158;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_168,
             msg_02);
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8._0_8_ = "Spannable(std::array<int, 3>{})";
  local_a8._M_parent = (_Base_ptr)0xc3b93e;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)(local_b8 + 0x10);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_170 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)&local_68,1,0,WARN,_cVar4,(size_t)&local_178,0x42);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  file_03.m_end = (iterator)0x43;
  file_03.m_begin = (iterator)&local_188;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_198,
             msg_03);
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8._0_8_ = "Spannable(Span<int>{})";
  local_a8._M_parent = (_Base_ptr)0xc3b955;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  p_Var1 = (_Base_ptr)(local_b8 + 0x10);
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_1a0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)&local_68,1,0,WARN,_cVar4,(size_t)&local_1a8,0x43);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  file_04.m_end = (iterator)0x44;
  file_04.m_begin = (iterator)&local_1b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1c8,
             msg_04);
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8._0_8_ = "Spannable(\"char array\")";
  local_a8._M_parent = (_Base_ptr)0xc3b96d;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_1d0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)&local_68,1,0,WARN,_cVar4,(size_t)&local_1d8,0x44);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  file_05.m_end = (iterator)0x45;
  file_05.m_begin = (iterator)&local_1e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1f8,
             msg_05);
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8._0_8_ = "Spannable(SpannableYes{})";
  local_a8._M_parent = (_Base_ptr)0xc3b987;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_200 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)&local_68,1,0,WARN,_cVar4,(size_t)&local_208,0x45);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  file_06.m_end = (iterator)0x46;
  file_06.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_228,
             msg_06);
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8._0_8_ = "!Spannable(SpannableNo{})";
  local_a8._M_parent = (_Base_ptr)0xc3b9a1;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_68._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/span_tests.cpp"
  ;
  local_230 = "";
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)&local_68,1,0,WARN,_cVar4,(size_t)&local_238,0x46);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(span_constructor_sfinae)
{
    BOOST_CHECK(Spannable(std::vector<int>{}));
    BOOST_CHECK(!Spannable(std::set<int>{}));
    BOOST_CHECK(!Spannable(std::vector<bool>{}));
    BOOST_CHECK(Spannable(std::array<int, 3>{}));
    BOOST_CHECK(Spannable(Span<int>{}));
    BOOST_CHECK(Spannable("char array"));
    BOOST_CHECK(Spannable(SpannableYes{}));
    BOOST_CHECK(!Spannable(SpannableNo{}));
}